

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfile.h
# Opt level: O0

long __thiscall CVmFileStream::get_len(CVmFileStream *this)

{
  long lVar1;
  CVmFile *in_RDI;
  long len;
  long orig;
  long in_stack_ffffffffffffffd8;
  
  CVmFile::get_pos(in_RDI);
  CVmFile::set_pos_from_eof(in_RDI,in_stack_ffffffffffffffd8);
  lVar1 = CVmFile::get_pos(in_RDI);
  CVmFile::set_pos(in_RDI,in_stack_ffffffffffffffd8);
  return lVar1;
}

Assistant:

long get_len()
    {
        /* remember the current seek position */
        long orig = fp_->get_pos();
        
        /* seek to the end of the file */
        fp_->set_pos_from_eof(0);

        /* the seek position is the file length */
        long len = fp_->get_pos();

        /* seek back to where we started */
        fp_->set_pos(orig);

        /* return the stream length */
        return len;
    }